

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::save_extra(Snes_Spc *this)

{
  sample_t_conflict1 *psVar1;
  sample_t_conflict1 *psVar2;
  sample_t_conflict1 *psVar3;
  sample_t_conflict1 *psVar4;
  sample_t_conflict1 *psVar5;
  sample_t_conflict1 *psVar6;
  
  psVar1 = (this->m).buf_end;
  psVar3 = (this->dsp).m.out;
  psVar2 = (this->m).buf_begin;
  psVar5 = psVar1;
  if (psVar3 <= psVar1 && psVar2 <= psVar3) {
    psVar5 = psVar3;
  }
  psVar4 = (this->m).extra_buf;
  for (psVar6 = psVar2 + (int)((this->m).extra_clocks >> 4 & 0xfffffffe); psVar6 < psVar5;
      psVar6 = psVar6 + 1) {
    *psVar4 = *psVar6;
    psVar4 = psVar4 + 1;
  }
  psVar5 = (this->dsp).m.extra;
  if (psVar3 <= psVar1 && psVar2 <= psVar3) {
    psVar3 = psVar5;
  }
  for (; psVar5 < psVar3; psVar5 = psVar5 + 1) {
    *psVar4 = *psVar5;
    psVar4 = psVar4 + 1;
  }
  (this->m).extra_pos = psVar4;
  return;
}

Assistant:

void Snes_Spc::save_extra()
{
	// Get end pointers
	sample_t const* main_end = m.buf_end;     // end of data written to buf
	sample_t const* dsp_end  = dsp.out_pos(); // end of data written to dsp.extra()
	if ( m.buf_begin <= dsp_end && dsp_end <= main_end )
	{
		main_end = dsp_end;
		dsp_end  = dsp.extra(); // nothing in DSP's extra
	}
	
	// Copy any extra samples at these ends into extra_buf
	sample_t* out = m.extra_buf;
	sample_t const* in;
	for ( in = m.buf_begin + sample_count(); in < main_end; in++ )
		*out++ = *in;
	for ( in = dsp.extra(); in < dsp_end ; in++ )
		*out++ = *in;
	
	m.extra_pos = out;
	assert( out <= &m.extra_buf [extra_size] );
}